

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O3

void __thiscall cppcms::http::response::response(response *this,context *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _data *this_00;
  connection *c;
  service *psVar2;
  cached_settings *pcVar3;
  string local_60;
  string local_40;
  
  this_00 = (_data *)operator_new(0x530);
  c = http::context::connection(context);
  _data::_data(this_00,c);
  (this->d).ptr_ = this_00;
  this->context_ = context;
  this->stream_ = (ostream *)0x0;
  this->io_mode_ = asynchronous;
  this->field_0x1c = this->field_0x1c & 0xf0;
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"text/html","");
  set_content_header(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  psVar2 = http::context::service(this->context_);
  pcVar3 = service::cached_settings(psVar2);
  if ((pcVar3->service).disable_xpowered_by == false) {
    psVar2 = http::context::service(this->context_);
    pcVar3 = service::cached_settings(psVar2);
    if ((pcVar3->service).disable_xpowered_by_version == true) {
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"X-Powered-By","");
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CppCMS","");
      cppcms::impl::response_headers::set_header(&((this->d).ptr_)->headers,&local_60,&local_40);
    }
    else {
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"X-Powered-By","");
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CppCMS/2.0.0.beta2","");
      cppcms::impl::response_headers::set_header(&((this->d).ptr_)->headers,&local_60,&local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

response::response(context &context) :
	d(new _data(&context.connection())),
	context_(context),
	stream_(0),
	io_mode_(asynchronous),
	disable_compression_(0),
	ostream_requested_(0),
	copy_to_cache_(0),
	finalized_(0)
{
	set_content_header("text/html");
	if(context_.service().cached_settings().service.disable_xpowered_by==false) {
		if(context_.service().cached_settings().service.disable_xpowered_by_version)
			set_header("X-Powered-By", CPPCMS_PACKAGE_NAME);
		else
			set_header("X-Powered-By", CPPCMS_PACKAGE_NAME "/" CPPCMS_PACKAGE_VERSION);
	}
}